

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_info::torrent_info(torrent_info *this,string *filename,error_code *ec)

{
  bool bVar1;
  int iVar2;
  span<const_char> buffer;
  torrent_info *this_00;
  load_torrent_limits local_b4;
  libtorrent *local_a0;
  char *local_98;
  undefined1 local_90 [8];
  bdecode_node e;
  undefined1 local_38 [4];
  int ret;
  vector<char,_std::allocator<char>_> buf;
  error_code *ec_local;
  string *filename_local;
  torrent_info *this_local;
  
  this_00 = this;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = ec;
  file_storage::file_storage(&this->m_files);
  libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::copy_ptr(&this->m_orig_files);
  libtorrent::aux::
  container_wrapper<libtorrent::v1_2::announce_entry,_int,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  ::container_wrapper(&this->m_urls);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::vector
            (&this->m_web_seeds);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&this->m_nodes);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->m_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&this->m_owned_similar_torrents);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_collections);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_owned_collections);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::container_wrapper(&this->m_merkle_tree);
  libtorrent::aux::
  container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::container_wrapper(&this->m_piece_layers);
  boost::shared_array<char>::shared_array(&this->m_info_section);
  ::std::__cxx11::string::string((string *)&this->m_comment);
  ::std::__cxx11::string::string((string *)&this->m_created_by);
  bdecode_node::bdecode_node(&this->m_info_dict);
  this->m_creation_date = 0;
  info_hash_t::info_hash_t(&this->m_info_hash);
  this->m_piece_hashes = 0;
  this->m_info_section_size = 0;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
  bitfield_flag(&this->m_flags);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38);
  iVar2 = anon_unknown_1::load_file
                    (filename,(vector<char,_std::allocator<char>_> *)local_38,
                     (error_code *)
                     buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,80000000);
  if (iVar2 < 0) {
    e.m_size = 1;
  }
  else {
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_a0,(vector<char,_std::allocator<char>_> *)local_38);
    buffer.m_len = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
    buffer.m_ptr = local_98;
    bdecode((bdecode_node *)local_90,local_a0,buffer,(error_code *)0x0,(int *)0x64,2000000,
            (int)this_00);
    bVar1 = boost::system::error_code::operator_cast_to_bool
                      ((error_code *)
                       buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    if (!bVar1) {
      local_b4.max_buffer_size = 10000000;
      local_b4.max_pieces = 0x200000;
      local_b4.max_decode_depth = 100;
      local_b4.max_decode_tokens = 3000000;
      local_b4.max_duplicate_filenames = 500;
      parse_torrent_file(this_00,(bdecode_node *)local_90,
                         (error_code *)
                         buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                         &local_b4);
    }
    e.m_size = (int)bVar1;
    bdecode_node::~bdecode_node((bdecode_node *)local_90);
  }
  ::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_38);
  return;
}

Assistant:

torrent_info::torrent_info(std::string const& filename, error_code& ec)
	{
		std::vector<char> buf;
		int ret = load_file(filename, buf, ec);
		if (ret < 0) return;

		bdecode_node e = bdecode(buf, ec);
		if (ec) return;
		parse_torrent_file(e, ec, load_torrent_limits{});

		INVARIANT_CHECK;
	}